

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalGetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  Index index;
  bool bVar1;
  ValueType local_b8;
  Type type;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index translated_local_index;
  Index local_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = param_1;
  _translated_local_index = this;
  local_20 = TranslateLocalIndex(this,param_1);
  GetLocation(&local_48,this);
  index = local_1c;
  GetLocation((Location *)&type,this);
  Var::Var(&local_90,index,(Location *)&type);
  local_24 = (Enum)SharedValidator::OnLocalGet(&this->validator_,&local_48,&local_90);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_b8 = FuncDesc::GetLocalType(this->func_,local_1c);
    bVar1 = Type::IsRef(&local_b8);
    if (bVar1) {
      Istream::Emit(this->istream_,InterpLocalGetRef,local_20);
    }
    else {
      Istream::Emit(this->istream_,LocalGet,local_20);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnLocalGetExpr(Index local_index) {
  // Get the translated index before calling validator_.OnLocalGet because it
  // will update the type stack size. We need the index to be relative to the
  // old stack size.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(
      validator_.OnLocalGet(GetLocation(), Var(local_index, GetLocation())));

  Type type = func_->GetLocalType(local_index);
  if (type.IsRef()) {
    istream_.Emit(Opcode::InterpLocalGetRef, translated_local_index);
  } else {
    istream_.Emit(Opcode::LocalGet, translated_local_index);
  }
  return Result::Ok;
}